

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddMatMult.c
# Opt level: O1

DdNode * Cudd_addTriangle(DdManager *dd,DdNode *f,DdNode *g,DdNode **z,int nz)

{
  int *piVar1;
  size_t __size;
  int iVar2;
  int *vars;
  DdNode *cube;
  DdNode *pDVar3;
  ulong uVar4;
  
  iVar2 = dd->size;
  __size = (long)iVar2 * 4;
  vars = (int *)malloc(__size);
  if (vars == (int *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    if (0 < iVar2) {
      memset(vars,0xff,__size);
    }
    if (0 < nz) {
      uVar4 = 0;
      do {
        vars[z[uVar4]->index] = (int)uVar4;
        uVar4 = uVar4 + 1;
      } while ((uint)nz != uVar4);
    }
    cube = Cudd_addComputeCube(dd,z,(int *)0x0,nz);
    if (cube != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)cube & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      do {
        dd->reordered = 0;
        pDVar3 = addTriangleRecur(dd,f,g,vars,cube);
      } while (dd->reordered == 1);
      if (pDVar3 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,cube);
      }
      else {
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,cube);
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
      }
      free(vars);
      return pDVar3;
    }
    free(vars);
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_addTriangle(
  DdManager * dd,
  DdNode * f,
  DdNode * g,
  DdNode ** z,
  int  nz)
{
    int    i, nvars, *vars;
    DdNode *res, *cube;

    nvars = dd->size;
    vars = ABC_ALLOC(int, nvars);
    if (vars == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < nvars; i++) vars[i] = -1;
    for (i = 0; i < nz; i++) vars[z[i]->index] = i;
    cube = Cudd_addComputeCube(dd, z, NULL, nz);
    if (cube == NULL) {
        ABC_FREE(vars);
        return(NULL);
    }
    cuddRef(cube);

    do {
        dd->reordered = 0;
        res = addTriangleRecur(dd, f, g, vars, cube);
    } while (dd->reordered == 1);
    if (res != NULL) cuddRef(res);
    Cudd_RecursiveDeref(dd,cube);
    if (res != NULL) cuddDeref(res);
    ABC_FREE(vars);
    return(res);

}